

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Capturer::Capturer
          (Capturer *this,StringRef macroName,SourceLineInfo *lineInfo,OfType resultType,
          StringRef names)

{
  Capturer *pCVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  IResultCapture *pIVar5;
  ulong uVar6;
  ulong index;
  char c;
  anon_class_8_1_a855c668 trimmed;
  stack<char,_std::deque<char,_std::allocator<char>_>_> openings;
  byte local_101;
  Capturer *local_100;
  OfType local_f4;
  ulong local_f0;
  SourceLineInfo *local_e8;
  anon_class_8_1_a855c668 local_e0;
  StringRef local_d8;
  ostream *local_c8;
  StringRef local_c0;
  string local_b0;
  _Deque_base<char,_std::allocator<char>_> local_90;
  SourceLineInfo local_40;
  ulong index_00;
  
  local_c0.m_size = macroName.m_size;
  local_c0.m_start = macroName.m_start;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f4 = resultType;
  local_e8 = lineInfo;
  pIVar5 = getResultCapture();
  this->m_resultCapture = pIVar5;
  this->m_captured = 0;
  local_100 = this;
  local_e0.names = &names;
  std::stack<char,std::deque<char,std::allocator<char>>>::
  stack<std::deque<char,std::allocator<char>>,void>
            ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_90);
  local_f0 = 0;
  index = 0;
  do {
    pCVar1 = local_100;
    if (names.m_size <= index) {
      if (local_90._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_90._M_impl.super__Deque_impl_data._M_start._M_cur) {
        __assert_fail("openings.empty() && \"Mismatched openings\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/catch2/catch.hpp"
                      ,0x2e90,
                      "Catch::Capturer::Capturer(StringRef, const SourceLineInfo &, ResultWas::OfType, StringRef)"
                     );
      }
      std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
      emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
                ((vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>> *)local_100,
                 &local_c0,local_e8,&local_f4);
      local_d8 = Capturer::anon_class_8_1_a855c668::operator()(&local_e0,local_f0,names.m_size - 1);
      StringRef::operator_cast_to_string(&local_b0,&local_d8);
      std::__cxx11::string::operator=
                ((string *)
                 &(pCVar1->m_messages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1].message,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::append
                ((char *)&(pCVar1->m_messages).
                          super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].message);
      clara::std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_90);
      return;
    }
    bVar2 = StringRef::operator[](&names,index);
    index_00 = index;
    local_101 = bVar2;
    switch(bVar2) {
    case 0x22:
    case 0x27:
      while( true ) {
        uVar6 = index;
        index_00 = uVar6 + 1;
        if (names.m_size <= index_00) {
          ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_d8);
          local_40.file =
               "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/catch2/catch.hpp"
          ;
          local_40.line = 0x2e6d;
          Catch::operator<<(local_c8,&local_40);
          std::operator<<((ostream *)local_c8,": Internal Catch2 error: ");
          std::operator<<((ostream *)local_c8,"CAPTURE parsing encountered unmatched quote");
          std::__cxx11::stringbuf::str();
          throw_logic_error(&local_b0);
        }
        bVar3 = StringRef::operator[](&names,index_00);
        if (bVar3 == bVar2) break;
        cVar4 = StringRef::operator[](&names,index_00);
        index = index_00;
        if (cVar4 == '\\') {
          index = uVar6 + 2;
        }
      }
      break;
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x2a:
    case 0x2b:
      break;
    case 0x29:
switchD_001596d7_caseD_29:
      clara::std::deque<char,_std::allocator<char>_>::pop_back
                ((deque<char,_std::allocator<char>_> *)&local_90);
      break;
    case 0x2c:
      index_00 = local_f0;
      if ((local_f0 != index) &&
         (index_00 = index,
         local_90._M_impl.super__Deque_impl_data._M_finish._M_cur ==
         local_90._M_impl.super__Deque_impl_data._M_start._M_cur)) {
        std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
        emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
                  ((vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>> *)local_100,
                   &local_c0,local_e8,&local_f4);
        local_d8 = Capturer::anon_class_8_1_a855c668::operator()(&local_e0,local_f0,index);
        StringRef::operator_cast_to_string(&local_b0,&local_d8);
        pCVar1 = local_100;
        std::__cxx11::string::operator=
                  ((string *)
                   &(local_100->m_messages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1].message,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::append
                  ((char *)&(pCVar1->m_messages).
                            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].message);
        local_f0 = index;
      }
      break;
    default:
      if (bVar2 != 0x5b) {
        if (bVar2 != 0x5d) {
          if (bVar2 == 0x7b) goto switchD_001596d7_caseD_28;
          if (bVar2 != 0x7d) break;
        }
        goto switchD_001596d7_caseD_29;
      }
    case 0x28:
switchD_001596d7_caseD_28:
      clara::std::deque<char,_std::allocator<char>_>::push_back
                ((deque<char,_std::allocator<char>_> *)&local_90,(value_type *)&local_101);
    }
    index = index_00 + 1;
  } while( true );
}

Assistant:

Capturer::Capturer( StringRef macroName, SourceLineInfo const& lineInfo, ResultWas::OfType resultType, StringRef names ) {
        auto trimmed = [&] (size_t start, size_t end) {
            while (names[start] == ',' || isspace(static_cast<unsigned char>(names[start]))) {
                ++start;
            }
            while (names[end] == ',' || isspace(static_cast<unsigned char>(names[end]))) {
                --end;
            }
            return names.substr(start, end - start + 1);
        };
        auto skipq = [&] (size_t start, char quote) {
            for (auto i = start + 1; i < names.size() ; ++i) {
                if (names[i] == quote)
                    return i;
                if (names[i] == '\\')
                    ++i;
            }
            CATCH_INTERNAL_ERROR("CAPTURE parsing encountered unmatched quote");
        };

        size_t start = 0;
        std::stack<char> openings;
        for (size_t pos = 0; pos < names.size(); ++pos) {
            char c = names[pos];
            switch (c) {
            case '[':
            case '{':
            case '(':
            // It is basically impossible to disambiguate between
            // comparison and start of template args in this context
//            case '<':
                openings.push(c);
                break;
            case ']':
            case '}':
            case ')':
//           case '>':
                openings.pop();
                break;
            case '"':
            case '\'':
                pos = skipq(pos, c);
                break;
            case ',':
                if (start != pos && openings.empty()) {
                    m_messages.emplace_back(macroName, lineInfo, resultType);
                    m_messages.back().message = static_cast<std::string>(trimmed(start, pos));
                    m_messages.back().message += " := ";
                    start = pos;
                }
            }
        }
        assert(openings.empty() && "Mismatched openings");
        m_messages.emplace_back(macroName, lineInfo, resultType);
        m_messages.back().message = static_cast<std::string>(trimmed(start, names.size() - 1));
        m_messages.back().message += " := ";
    }